

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O3

void logwrite(LogContext *ctx,ptrlen data)

{
  anon_enum_32 aVar1;
  size_t sVar2;
  ulong __n;
  
  __n = data.len;
  aVar1 = ctx->state;
  if (aVar1 == L_CLOSED) {
    logfopen(ctx);
    aVar1 = ctx->state;
  }
  if (aVar1 == L_OPEN) {
    if ((FILE *)ctx->lgfp == (FILE *)0x0) {
      __assert_fail("ctx->lgfp",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/logging.c",
                    0x2f,"void logwrite(LogContext *, ptrlen)");
    }
    sVar2 = fwrite(data.ptr,1,__n,(FILE *)ctx->lgfp);
    if (sVar2 < __n) {
      if ((FILE *)ctx->lgfp != (FILE *)0x0) {
        fclose((FILE *)ctx->lgfp);
        ctx->lgfp = (FILE *)0x0;
      }
      ctx->state = L_ERROR;
      (*ctx->lp->vt->eventlog)(ctx->lp,"Disabled writing session log due to error while writing");
      return;
    }
  }
  else if (aVar1 == L_OPENING) {
    bufchain_add(&ctx->queue,data.ptr,__n);
    return;
  }
  return;
}

Assistant:

static void logwrite(LogContext *ctx, ptrlen data)
{
    /*
     * In state L_CLOSED, we call logfopen, which will set the state
     * to one of L_OPENING, L_OPEN or L_ERROR. Hence we process all of
     * those three _after_ processing L_CLOSED.
     */
    if (ctx->state == L_CLOSED)
        logfopen(ctx);

    if (ctx->state == L_OPENING) {
        bufchain_add(&ctx->queue, data.ptr, data.len);
    } else if (ctx->state == L_OPEN) {
        assert(ctx->lgfp);
        if (fwrite(data.ptr, 1, data.len, ctx->lgfp) < data.len) {
            logfclose(ctx);
            ctx->state = L_ERROR;
            lp_eventlog(ctx->lp, "Disabled writing session log "
                        "due to error while writing");
        }
    }                                  /* else L_ERROR, so ignore the write */
}